

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.h
# Opt level: O0

void set_segment_id(uint8_t *segment_ids,int mi_offset,int x_mis,int y_mis,int mi_stride,
                   uint8_t segment_id)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int y;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    memset((void *)(in_RDI + in_ESI + (long)(local_20 * in_R8D)),(uint)in_R9B,(long)in_EDX);
  }
  return;
}

Assistant:

static inline void set_segment_id(uint8_t *segment_ids, int mi_offset,
                                  int x_mis, int y_mis, int mi_stride,
                                  uint8_t segment_id) {
  segment_ids += mi_offset;
  for (int y = 0; y < y_mis; ++y) {
    memset(&segment_ids[y * mi_stride], segment_id,
           x_mis * sizeof(segment_ids[0]));
  }
}